

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O1

double SoapySDRDevice_getGainElement(SoapySDRDevice *device,int direction,size_t channel,char *name)

{
  undefined1 *puVar1;
  allocator local_59;
  double local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014ce80);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  std::__cxx11::string::string((string *)local_50,name,&local_59);
  local_58 = (double)(**(code **)(*(long *)device + 0x1a0))(device,direction,channel,local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return local_58;
}

Assistant:

double SoapySDRDevice_getGainElement(const SoapySDRDevice *device, const int direction, const size_t channel, const char *name)
{
    __SOAPY_SDR_C_TRY
    return device->getGain(direction, channel, name);
    __SOAPY_SDR_C_CATCH_RET(NAN);
}